

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

size_t mz_zip_mem_read_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  size_t local_48;
  size_t local_40;
  size_t s;
  mz_zip_archive *pZip;
  size_t n_local;
  void *pBuf_local;
  mz_uint64 file_ofs_local;
  void *pOpaque_local;
  
  if (file_ofs < *pOpaque) {
    local_48 = n;
    if (*pOpaque - file_ofs < n) {
      local_48 = *pOpaque - file_ofs;
    }
    local_40 = local_48;
  }
  else {
    local_40 = 0;
  }
  memcpy(pBuf,(void *)(*(long *)(*(long *)((long)pOpaque + 0x68) + 0x80) + file_ofs),local_40);
  return local_40;
}

Assistant:

static size_t mz_zip_mem_read_func(void *pOpaque, mz_uint64 file_ofs,
                                   void *pBuf, size_t n) {
  mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
  size_t s = (file_ofs >= pZip->m_archive_size)
                 ? 0
                 : (size_t)MZ_MIN(pZip->m_archive_size - file_ofs, n);
  memcpy(pBuf, (const mz_uint8 *)pZip->m_pState->m_pMem + file_ofs, s);
  return s;
}